

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yield_token_conversion.cpp
# Opt level: O0

int main(void)

{
  count_type cVar1;
  undefined1 local_28 [8];
  io_context io;
  anon_class_8_1_a7c1402f_for_f_ f;
  int count;
  
  f.count._4_4_ = 0;
  io.impl_ = (impl_type *)&f;
  f.count._0_4_ = 0;
  boost::asio::io_context::io_context((io_context *)local_28);
  ufiber::spawn<boost::asio::io_context,main::__0&>
            ((io_context *)local_28,(anon_class_8_1_a7c1402f_for_f_ *)&io.impl_);
  cVar1 = boost::asio::io_context::run((io_context *)local_28);
  boost::detail::test_impl
            ("io.run() > 0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp"
             ,0x29,"int main()",cVar1 != 0);
  boost::detail::test_impl
            ("count == 3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/djarek[P]ufiber/tests/ufiber/yield_token_conversion.cpp"
             ,0x2a,"int main()",(int)f.count == 3);
  f.count._4_4_ = boost::report_errors();
  boost::asio::io_context::~io_context((io_context *)local_28);
  return f.count._4_4_;
}

Assistant:

int
main()
{
    // Check if it's possible to do yield_token conversions (e.g. to type erase
    // the executor)
    int count = 0;
    auto f =
      [&](ufiber::yield_token<boost::asio::io_context::executor_type> y) {
          ++count;
          ufiber::yield_token<boost::asio::io_context::executor_type> yield{y};
          // Check we don't get spawned into the system executor by accident
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          boost::asio::post(yield);
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          ++count;
          ufiber::yield_token<boost::asio::executor> yield2{y};
          boost::asio::post(yield2);
          BOOST_TEST(yield.get_executor().running_in_this_thread());
          ++count;
      };

    count = 0;
    boost::asio::io_context io{};
    ufiber::spawn(io, f);

    BOOST_TEST(io.run() > 0);
    BOOST_TEST(count == 3);

    return boost::report_errors();
}